

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O3

void save_point_list_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  bool bVar1;
  ostream *poVar2;
  float y;
  float x;
  Am_Point_List list;
  float local_48;
  float local_44;
  Am_Point_List local_40;
  
  Am_Load_Save_Context::Save_Type_Name(context,os,"Am_POINT_LIST");
  Am_Point_List::Am_Point_List(&local_40,value);
  Am_Point_List::Length(&local_40);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  Am_Point_List::Start(&local_40);
  while( true ) {
    bVar1 = Am_Point_List::Last(&local_40);
    if (bVar1) break;
    Am_Point_List::Get(&local_40,&local_44,&local_48);
    poVar2 = std::ostream::_M_insert<double>((double)local_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = std::ostream::_M_insert<double>((double)local_48);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    Am_Point_List::Next(&local_40);
  }
  Am_Point_List::~Am_Point_List(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_point_list,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  context.Save_Type_Name(os, "Am_POINT_LIST");
  Am_Point_List list = value;
  os << list.Length() << std::endl;
  float x, y;
  for (list.Start(); !list.Last(); list.Next()) {
    list.Get(x, y);
    os << x << " " << y << std::endl;
  }
}